

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::capturedExpressionWithSecondArgument
                   (string *__return_storage_ptr__,string *capturedExpression,string *secondArg)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *secondArg_local;
  string *capturedExpression_local;
  
  local_20 = secondArg;
  secondArg_local = capturedExpression;
  capturedExpression_local = __return_storage_ptr__;
  uVar3 = std::__cxx11::string::empty();
  bVar1 = false;
  if (((uVar3 & 1) != 0) || (bVar2 = std::operator==(local_20,"\"\""), bVar2)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)secondArg_local);
  }
  else {
    std::operator+(&local_40,secondArg_local,", ");
    bVar1 = true;
    std::operator+(__return_storage_ptr__,&local_40,local_20);
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string capturedExpressionWithSecondArgument( std::string const& capturedExpression, std::string const& secondArg ) {
        return secondArg.empty() || secondArg == "\"\""
            ? capturedExpression
            : capturedExpression + ", " + secondArg;
    }